

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo-types.cpp
# Opt level: O3

int __thiscall
yactfr::internal::PseudoVarWithIntRangesType::clone
          (PseudoVarWithIntRangesType *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,
          ...)

{
  PseudoVarWithIntRangesType *this_00;
  void *__child_stack_00;
  _Head_base<0UL,_const_yactfr::MapItem_*,_false> _Var1;
  _Head_base<0UL,_const_yactfr::MapItem_*,_false> local_a8;
  _Head_base<0UL,_const_yactfr::MapItem_*,_false> local_a0;
  vector<yactfr::IntegerRangeSet<unsigned_long_long,_false>,_std::allocator<yactfr::IntegerRangeSet<unsigned_long_long,_false>_>_>
  local_98;
  PseudoNamedDts local_80;
  undefined1 local_68 [72];
  
  PseudoVarType::_clonePseudoOpts(&local_80,(PseudoVarType *)__fn);
  std::
  vector<yactfr::IntegerRangeSet<unsigned_long_long,_false>,_std::allocator<yactfr::IntegerRangeSet<unsigned_long_long,_false>_>_>
  ::vector(&local_98,
           (vector<yactfr::IntegerRangeSet<unsigned_long_long,_false>,_std::allocator<yactfr::IntegerRangeSet<unsigned_long_long,_false>_>_>
            *)(__fn + 0xc0));
  if (*(__fn **)(__fn + 0x30) == (__fn *)0x0) {
    _Var1._M_head_impl = (MapItem *)0x0;
  }
  else {
    MapItem::clone((MapItem *)local_68,*(__fn **)(__fn + 0x30),__child_stack_00,__flags,__arg);
    _Var1._M_head_impl = (MapItem *)local_68._0_8_;
    local_68._0_8_ =
         (_Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>)0x0
    ;
    std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
              ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
               local_68);
  }
  local_a8._M_head_impl = _Var1._M_head_impl;
  this_00 = (PseudoVarWithIntRangesType *)operator_new(0xd8);
  local_68._0_8_ = local_68._0_8_ & 0xffffffffffffff00;
  local_a0._M_head_impl = _Var1._M_head_impl;
  if (__fn[0x50] == (__fn)0x1) {
    local_68._16_4_ = *(undefined4 *)(__fn + 0x60);
    local_68._8_8_ = *(type *)(__fn + 0x58);
    std::
    vector<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(local_68 + 0x18),
             (vector<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(__fn + 0x68));
    local_68._64_8_ = *(undefined8 *)(__fn + 0x90);
    local_68._48_8_ = *(undefined8 *)(__fn + 0x80);
    local_68._56_8_ = *(undefined8 *)(__fn + 0x88);
    local_68[0] = 1;
    local_a0._M_head_impl = local_a8._M_head_impl;
  }
  local_a8._M_head_impl = (MapItem *)0x0;
  PseudoVarWithIntRangesType
            (this_00,(optional<yactfr::internal::PseudoDataLoc> *)local_68,&local_80,&local_98,
             (Up *)&local_a0,*(TextLocation *)(__fn + 8));
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             &local_a0);
  if ((bool)local_68[0] == true) {
    std::
    vector<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_68 + 0x18));
  }
  (this->super_PseudoVarType).super_PseudoDt._vptr_PseudoDt = (_func_int **)this_00;
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             &local_a8);
  std::
  vector<yactfr::IntegerRangeSet<unsigned_long_long,_false>,_std::allocator<yactfr::IntegerRangeSet<unsigned_long_long,_false>_>_>
  ::~vector(&local_98);
  std::
  vector<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>,_std::allocator<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>_>_>
  ::~vector(&local_80);
  return (int)this;
}

Assistant:

PseudoDt::Up PseudoVarWithIntRangesType::clone() const
{
    return std::make_unique<PseudoVarWithIntRangesType>(this->pseudoSelLoc(),
                                                        this->_clonePseudoOpts(),
                                                        RangeSets {_rangeSets},
                                                        tryCloneAttrs(this->attrs()),
                                                        this->loc());
}